

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O3

void __thiscall cppjieba::DictTrie::LoadUserDict(DictTrie *this,string *filePaths)

{
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  ulong uVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string line;
  ifstream ifs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d8;
  undefined1 *local_3b8;
  long local_3b0;
  undefined1 local_3a8 [368];
  string local_238 [16];
  
  local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"|;","");
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  limonp::Split(filePaths,&local_3d8,local_238,0xffffffffffffffff);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
    operator_delete(local_238[0]._M_dataplus._M_p,local_238[0].field_2._M_allocated_capacity + 1);
  }
  if (local_3d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_3d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar4 = 0;
    do {
      std::ifstream::ifstream
                (local_238,
                 local_3d8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p,_S_in);
      cVar1 = std::__basic_file<char>::is_open();
      if (cVar1 == '\0') {
        limonp::Logger::Logger
                  ((Logger *)&local_3b8,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/DictTrie.hpp"
                   ,0x92);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_3b8,"exp: [ifs.is_open()",0x13);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b8,"] false. ",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_3b8,"open ",5);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_3b8,
                            local_3d8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_dataplus._M_p,
                            local_3d8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2," failed",7);
        limonp::Logger::~Logger((Logger *)&local_3b8);
      }
      local_3b0 = 0;
      local_3a8[0] = 0;
      local_3b8 = local_3a8;
      while( true ) {
        cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0]._M_dataplus._M_p + -0x18) +
                                (char)local_238);
        piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_238,(string *)&local_3b8,cVar1);
        if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
        if (local_3b0 != 0) {
          InserUserDictNode(this,(string *)&local_3b8);
        }
      }
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8,CONCAT71(local_3a8._1_7_,local_3a8[0]) + 1);
      }
      std::ifstream::~ifstream(local_238);
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)local_3d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_3d8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d8);
  return;
}

Assistant:

void LoadUserDict(const string& filePaths) {
    vector<string> files = limonp::Split(filePaths, "|;");
    size_t lineno = 0;
    for (size_t i = 0; i < files.size(); i++) {
      ifstream ifs(files[i].c_str());
      XCHECK(ifs.is_open()) << "open " << files[i] << " failed"; 
      string line;
      
      for (; getline(ifs, line); lineno++) {
        if (line.size() == 0) {
          continue;
        }
        InserUserDictNode(line);
      }
    }
  }